

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void google::protobuf::internal::PackedFieldHelper<3>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  long *ptr;
  RepeatedField<long> *array;
  int i;
  int index;
  
  if (*field != 0) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    WriteLengthTo<google::protobuf::internal::ArrayOutput>(*(uint32 *)((long)field + 0x10),output);
    for (index = 0; index < *field; index = index + 1) {
      ptr = RepeatedField<long>::Get((RepeatedField<long> *)field,index);
      OutputHelper<google::protobuf::internal::ArrayOutput,_3>::Serialize(ptr,output);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}